

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facets.h
# Opt level: O0

void __thiscall
booster::locale::boundary::boundary_indexing<wchar_t>::~boundary_indexing
          (boundary_indexing<wchar_t> *this)

{
  code *pcVar1;
  boundary_indexing<wchar_t> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class BOOSTER_API boundary_indexing<wchar_t> : public std::locale::facet {
            public:
                boundary_indexing(size_t refs=0) : std::locale::facet(refs)
                {
                }
                virtual index_type map(boundary_type t,wchar_t const *begin,wchar_t const *end) const = 0;

                static std::locale::id id;
                #if defined (__SUNPRO_CC) && defined (_RWSTD_VER)
                std::locale::id& __get_id (void) const { return id; }
                #endif
            }